

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

int stbi__do_zlib(stbi__zbuf *a,char *obuf,int olen,int exp,int parse_header)

{
  uint uVar1;
  int iVar2;
  byte *pbVar3;
  byte *pbVar4;
  stbi_uc *psVar5;
  bool bVar6;
  ushort uVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  stbi_uc sVar13;
  uint uVar14;
  stbi_uc *psVar15;
  long lVar16;
  ulong uVar17;
  long lVar18;
  char *zout;
  int iVar19;
  int iVar20;
  long lVar21;
  stbi_uc lencodes [455];
  stbi__zhuffman z_codelength;
  byte local_a08 [31];
  byte abStack_9e9 [258];
  stbi_uc asStack_8e7 [211];
  stbi__zhuffman local_814;
  
  a->zout_start = obuf;
  a->zout = obuf;
  a->zout_end = obuf + olen;
  a->z_expandable = exp;
  if (parse_header == 0) {
LAB_0016405b:
    a->num_bits = 0;
    a->code_buffer = 0;
    do {
      iVar11 = 0x563f30;
      if (a->num_bits < 1) {
        stbi__fill_bits(a);
      }
      iVar19 = a->num_bits;
      uVar8 = a->code_buffer;
      a->code_buffer = uVar8 >> 1;
      a->num_bits = iVar19 + -1;
      if (iVar19 < 3) {
        stbi__fill_bits(a);
      }
      iVar19 = a->num_bits;
      uVar12 = a->code_buffer;
      a->code_buffer = uVar12 >> 2;
      a->num_bits = iVar19 - 2U;
      iVar9 = 0;
      switch(uVar12 & 3) {
      case 0:
        uVar12 = iVar19 - 2U & 7;
        if (uVar12 != 0) {
          if (iVar19 < 2) {
            stbi__fill_bits(a);
          }
          a->code_buffer = a->code_buffer >> (sbyte)uVar12;
          a->num_bits = a->num_bits - uVar12;
        }
        iVar11 = a->num_bits;
        if (iVar11 < 1) {
          uVar17 = 0;
        }
        else {
          uVar12 = a->code_buffer;
          uVar17 = 0;
          iVar19 = iVar11;
          do {
            *(char *)((long)local_814.fast + uVar17) = (char)uVar12;
            uVar17 = uVar17 + 1;
            uVar12 = uVar12 >> 8;
            iVar11 = iVar19 + -8;
            bVar6 = 8 < iVar19;
            iVar19 = iVar11;
          } while (bVar6);
          a->code_buffer = uVar12;
          a->num_bits = iVar11;
        }
        if (iVar11 < 0) {
LAB_00164943:
          stbi__g_failure_reason = "zlib corrupt";
        }
        else {
          if ((uint)uVar17 < 4) {
            psVar15 = a->zbuffer;
            psVar5 = a->zbuffer_end;
            uVar17 = uVar17 & 0xffffffff;
            do {
              if (psVar15 < psVar5) {
                a->zbuffer = psVar15 + 1;
                sVar13 = *psVar15;
                psVar15 = psVar15 + 1;
              }
              else {
                sVar13 = '\0';
              }
              *(stbi_uc *)((long)local_814.fast + uVar17) = sVar13;
              uVar17 = uVar17 + 1;
            } while (uVar17 != 4);
          }
          if ((local_814.fast[1] ^ local_814.fast[0]) != 0xffff) goto LAB_00164943;
          uVar17 = (ulong)local_814.fast[0];
          if (a->zbuffer_end < a->zbuffer + uVar17) {
            stbi__g_failure_reason = "read past buffer";
          }
          else if ((a->zout + uVar17 <= a->zout_end) ||
                  (iVar11 = stbi__zexpand(a,a->zout,(uint)local_814.fast[0]), iVar11 != 0)) {
            memcpy(a->zout,a->zbuffer,uVar17);
            a->zbuffer = a->zbuffer + uVar17;
            a->zout = a->zout + uVar17;
            goto LAB_00164916;
          }
        }
        goto LAB_0016402e;
      case 1:
        iVar19 = stbi__zbuild_huffman
                           (&a->z_length,
                            "\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\b\b\b\b\b\b\b\b"
                            ,0x120);
        if (iVar19 == 0) {
          return 0;
        }
        psVar15 = 
        "\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05"
        ;
        iVar19 = 0x20;
        break;
      case 2:
        if (iVar19 < 7) {
          stbi__fill_bits(a);
        }
        iVar11 = a->num_bits;
        uVar12 = a->code_buffer;
        a->code_buffer = uVar12 >> 5;
        a->num_bits = iVar11 + -5;
        if (iVar11 < 10) {
          stbi__fill_bits(a);
        }
        iVar11 = a->num_bits;
        uVar14 = a->code_buffer;
        a->code_buffer = uVar14 >> 5;
        a->num_bits = iVar11 + -5;
        if (iVar11 < 9) {
          stbi__fill_bits(a);
        }
        uVar12 = uVar12 & 0x1f;
        iVar11 = uVar12 + 0x101;
        iVar19 = (uVar14 & 0x1f) + 1;
        uVar14 = a->code_buffer;
        a->code_buffer = uVar14 >> 4;
        a->num_bits = a->num_bits + -4;
        local_a08[0] = 0;
        local_a08[1] = 0;
        local_a08[2] = 0;
        local_a08[3] = 0;
        local_a08[4] = 0;
        local_a08[5] = 0;
        local_a08[6] = 0;
        local_a08[7] = 0;
        local_a08[8] = 0;
        local_a08[9] = 0;
        local_a08[10] = 0;
        local_a08[0xb] = 0;
        local_a08[0xc] = 0;
        local_a08[0xd] = 0;
        local_a08[0xe] = 0;
        local_a08[0xf] = 0;
        local_a08[0x10] = 0;
        local_a08[0x11] = 0;
        local_a08[0x12] = 0;
        lVar21 = 0;
        do {
          if (a->num_bits < 3) {
            stbi__fill_bits(a);
          }
          uVar10 = a->code_buffer;
          a->code_buffer = uVar10 >> 3;
          a->num_bits = a->num_bits + -3;
          local_a08[(byte)(&stbi__compute_huffman_codes(stbi__zbuf*)::length_dezigzag)[lVar21]] =
               (byte)uVar10 & 7;
          lVar21 = lVar21 + 1;
        } while ((ulong)(uVar14 & 0xf) + 4 != lVar21);
        iVar9 = stbi__zbuild_huffman(&local_814,local_a08,0x13);
        if (iVar9 == 0) goto LAB_0016402e;
        iVar9 = iVar19 + iVar11;
        iVar20 = 0;
        while( true ) {
          if (iVar9 <= iVar20) break;
          if (a->num_bits < 0x10) {
            uVar14 = 0xffffffff;
            if (a->zbuffer < a->zbuffer_end) {
              stbi__fill_bits(a);
              goto LAB_00164284;
            }
          }
          else {
LAB_00164284:
            uVar10 = a->code_buffer;
            uVar7 = local_814.fast[uVar10 & 0x1ff];
            if (uVar7 == 0) {
              uVar7 = (ushort)uVar10 << 8 | (ushort)uVar10 >> 8;
              uVar14 = (uVar7 & 0xf0f) << 4 | (uVar7 & 0xf0f0) >> 4;
              uVar14 = (uVar14 >> 2 & 0x3333) + (uVar14 & 0x3333) * 4;
              uVar1 = (uVar14 >> 1 & 0x5555) + (uVar14 & 0x5555) * 2;
              lVar21 = 0;
              do {
                lVar16 = lVar21;
                lVar21 = lVar16 + 1;
              } while (local_814.maxcode[lVar16 + 10] <= (int)uVar1);
              uVar14 = 0xffffffff;
              if (((lVar16 + 10U < 0x10) &&
                  (lVar18 = (ulong)local_814.firstsymbol[lVar16 + 10] +
                            ((ulong)(uVar1 >> (7U - (char)lVar21 & 0x1f)) -
                            (ulong)local_814.firstcode[lVar16 + 10]), (uint)lVar18 < 0x120)) &&
                 ((ulong)*(byte *)((long)&local_814 + lVar18 + 0x484) - 9 == lVar21)) {
                a->code_buffer = uVar10 >> ((byte)(lVar16 + 10U) & 0x1f);
                a->num_bits = (a->num_bits - (int)lVar21) + -9;
                uVar14 = (uint)*(ushort *)((long)&local_814 + lVar18 * 2 + 0x5a4);
              }
            }
            else {
              a->code_buffer = uVar10 >> ((byte)(uVar7 >> 9) & 0x1f);
              a->num_bits = a->num_bits - (uint)(uVar7 >> 9);
              uVar14 = uVar7 & 0x1ff;
            }
          }
          if (uVar14 < 0x13) {
            if ((int)uVar14 < 0x10) {
              lVar21 = (long)iVar20;
              iVar20 = iVar20 + 1;
              abStack_9e9[lVar21 + 1] = (char)uVar14;
            }
            else {
              iVar2 = a->num_bits;
              if (uVar14 == 0x11) {
                if (iVar2 < 3) {
                  stbi__fill_bits(a);
                }
                uVar14 = a->code_buffer;
                a->code_buffer = uVar14 >> 3;
                a->num_bits = a->num_bits + -3;
                uVar14 = (uVar14 & 7) + 3;
LAB_00164428:
                uVar10 = 0;
              }
              else {
                if (uVar14 != 0x10) {
                  if (iVar2 < 7) {
                    stbi__fill_bits(a);
                  }
                  uVar14 = a->code_buffer;
                  a->code_buffer = uVar14 >> 7;
                  a->num_bits = a->num_bits + -7;
                  uVar14 = (uVar14 & 0x7f) + 0xb;
                  goto LAB_00164428;
                }
                if (iVar2 < 2) {
                  stbi__fill_bits(a);
                }
                uVar14 = a->code_buffer;
                a->code_buffer = uVar14 >> 2;
                a->num_bits = a->num_bits + -2;
                if (iVar20 == 0) {
                  iVar20 = 0;
                  goto LAB_00164376;
                }
                uVar14 = (uVar14 & 3) + 3;
                uVar10 = (uint)abStack_9e9[iVar20];
              }
              if (iVar9 - iVar20 < (int)uVar14) goto LAB_00164376;
              memset(abStack_9e9 + (long)iVar20 + 1,uVar10,(ulong)uVar14);
              iVar20 = iVar20 + uVar14;
            }
            bVar6 = true;
          }
          else {
LAB_00164376:
            stbi__g_failure_reason = "bad codelengths";
            bVar6 = false;
          }
          if (!bVar6) goto LAB_0016402e;
        }
        if (iVar9 != iVar20) {
          stbi__g_failure_reason = "bad codelengths";
          goto LAB_0016402e;
        }
        iVar11 = stbi__zbuild_huffman(&a->z_length,(stbi_uc *)((long)abStack_9e9 + 1),iVar11);
        if (iVar11 == 0) goto LAB_0016402e;
        psVar15 = asStack_8e7 + uVar12;
        iVar11 = 0;
        break;
      case 3:
        goto switchD_001640d9_caseD_3;
      }
      iVar19 = stbi__zbuild_huffman(&a->z_distance,psVar15,iVar19);
      if (iVar19 == 0) goto LAB_0016402e;
      zout = a->zout;
      do {
        if (a->num_bits < 0x10) {
          uVar12 = 0xffffffff;
          if (a->zbuffer < a->zbuffer_end) {
            stbi__fill_bits(a);
            goto LAB_001644d5;
          }
        }
        else {
LAB_001644d5:
          uVar14 = a->code_buffer;
          uVar7 = (a->z_length).fast[uVar14 & 0x1ff];
          if (uVar7 == 0) {
            uVar7 = (ushort)uVar14 << 8 | (ushort)uVar14 >> 8;
            uVar12 = (uVar7 & 0xf0f) << 4 | (uVar7 & 0xf0f0) >> 4;
            uVar12 = (uVar12 >> 2 & 0x3333) + (uVar12 & 0x3333) * 4;
            uVar10 = (uVar12 >> 1 & 0x5555) + (uVar12 & 0x5555) * 2;
            lVar21 = 0;
            do {
              lVar16 = lVar21;
              lVar21 = lVar16 + 1;
            } while ((a->z_length).maxcode[lVar16 + 10] <= (int)uVar10);
            uVar12 = 0xffffffff;
            if (((lVar16 + 10U < 0x10) &&
                (lVar18 = (ulong)(a->z_length).firstsymbol[lVar16 + 10] +
                          ((ulong)(uVar10 >> (7U - (char)lVar21 & 0x1f)) -
                          (ulong)(a->z_length).firstcode[lVar16 + 10]), (uint)lVar18 < 0x120)) &&
               ((ulong)*(byte *)((long)a + lVar18 + 0x4b8) - 9 == lVar21)) {
              a->code_buffer = uVar14 >> ((byte)(lVar16 + 10U) & 0x1f);
              a->num_bits = (a->num_bits - (int)lVar21) + -9;
              uVar12 = (uint)*(ushort *)((long)a + lVar18 * 2 + 0x5d8);
            }
          }
          else {
            a->code_buffer = uVar14 >> ((byte)(uVar7 >> 9) & 0x1f);
            a->num_bits = a->num_bits - (uint)(uVar7 >> 9);
            uVar12 = uVar7 & 0x1ff;
          }
        }
        if ((int)uVar12 < 0x100) {
          if ((int)uVar12 < 0) {
LAB_001647ca:
            stbi__g_failure_reason = "bad huffman code";
            goto LAB_001647d8;
          }
          if (a->zout_end <= zout) {
            iVar19 = stbi__zexpand(a,zout,1);
            if (iVar19 == 0) goto LAB_001647d8;
            zout = a->zout;
          }
          *zout = (char)uVar12;
          zout = zout + 1;
          bVar6 = true;
        }
        else if (uVar12 == 0x100) {
          a->zout = zout;
          iVar11 = 1;
          bVar6 = false;
        }
        else {
          uVar17 = (ulong)(uVar12 - 0x101);
          uVar12 = stbi__zlength_base[uVar17];
          if (0xffffffffffffffeb < uVar17 - 0x1c) {
            iVar19 = stbi__zlength_extra[uVar17];
            if (a->num_bits < iVar19) {
              stbi__fill_bits(a);
            }
            uVar14 = a->code_buffer;
            a->code_buffer = uVar14 >> ((byte)iVar19 & 0x1f);
            a->num_bits = a->num_bits - iVar19;
            uVar12 = uVar12 + (~(-1 << ((byte)iVar19 & 0x1f)) & uVar14);
          }
          if (a->num_bits < 0x10) {
            uVar17 = 0xffffffff;
            if (a->zbuffer < a->zbuffer_end) {
              stbi__fill_bits(a);
              goto LAB_00164682;
            }
          }
          else {
LAB_00164682:
            uVar14 = a->code_buffer;
            uVar7 = (a->z_distance).fast[uVar14 & 0x1ff];
            if (uVar7 == 0) {
              uVar7 = (ushort)uVar14 << 8 | (ushort)uVar14 >> 8;
              uVar10 = (uVar7 & 0xf0f) << 4 | (uVar7 & 0xf0f0) >> 4;
              uVar10 = (uVar10 >> 2 & 0x3333) + (uVar10 & 0x3333) * 4;
              uVar10 = (uVar10 >> 1 & 0x5555) + (uVar10 & 0x5555) * 2;
              lVar21 = 0;
              do {
                lVar16 = lVar21;
                lVar21 = lVar16 + 1;
              } while ((a->z_distance).maxcode[lVar16 + 10] <= (int)uVar10);
              uVar17 = 0xffffffff;
              if (((lVar16 + 10U < 0x10) &&
                  (lVar18 = (ulong)(a->z_distance).firstsymbol[lVar16 + 10] +
                            ((ulong)(uVar10 >> (7U - (char)lVar21 & 0x1f)) -
                            (ulong)(a->z_distance).firstcode[lVar16 + 10]), (uint)lVar18 < 0x120))
                 && ((ulong)*(byte *)((long)a + lVar18 + 0xc9c) - 9 == lVar21)) {
                a->code_buffer = uVar14 >> ((byte)(lVar16 + 10U) & 0x1f);
                a->num_bits = (a->num_bits - (int)lVar21) + -9;
                uVar17 = (ulong)*(ushort *)((long)a + lVar18 * 2 + 0xdbc);
              }
            }
            else {
              a->code_buffer = uVar14 >> ((byte)(uVar7 >> 9) & 0x1f);
              a->num_bits = a->num_bits - (uint)(uVar7 >> 9);
              uVar17 = (ulong)(uVar7 & 0x1ff);
            }
          }
          if ((int)uVar17 < 0) goto LAB_001647ca;
          iVar19 = stbi__zdist_base[uVar17];
          if (0xffffffffffffffe5 < uVar17 - 0x1e) {
            iVar9 = stbi__zdist_extra[uVar17];
            if (a->num_bits < iVar9) {
              stbi__fill_bits(a);
            }
            uVar14 = a->code_buffer;
            a->code_buffer = uVar14 >> ((byte)iVar9 & 0x1f);
            a->num_bits = a->num_bits - iVar9;
            iVar19 = iVar19 + (~(-1 << ((byte)iVar9 & 0x1f)) & uVar14);
          }
          if ((long)zout - (long)a->zout_start < (long)iVar19) {
            stbi__g_failure_reason = "bad dist";
LAB_001647d8:
            bVar6 = false;
            iVar11 = 0;
          }
          else {
            if (a->zout_end < zout + (int)uVar12) {
              iVar9 = stbi__zexpand(a,zout,uVar12);
              if (iVar9 == 0) goto LAB_001647d8;
              zout = a->zout;
            }
            lVar21 = -(long)iVar19;
            if (iVar19 == 1) {
              bVar6 = true;
              if (uVar12 != 0) {
                memset(zout,(uint)(byte)zout[lVar21],(ulong)uVar12);
                zout = zout + (ulong)(uVar12 - 1) + 1;
              }
            }
            else {
              bVar6 = true;
              for (; uVar12 != 0; uVar12 = uVar12 - 1) {
                *zout = zout[lVar21];
                zout = zout + 1;
              }
            }
          }
        }
      } while (bVar6);
      if (iVar11 == 0) {
        return 0;
      }
LAB_00164916:
    } while ((uVar8 & 1) == 0);
    iVar9 = 1;
  }
  else {
    pbVar3 = a->zbuffer;
    pbVar4 = a->zbuffer_end;
    uVar12 = 0;
    uVar8 = 0;
    if (pbVar3 < pbVar4) {
      a->zbuffer = pbVar3 + 1;
      uVar8 = (uint)*pbVar3;
    }
    pbVar3 = a->zbuffer;
    if (pbVar3 < pbVar4) {
      a->zbuffer = pbVar3 + 1;
      uVar12 = (uint)*pbVar3;
    }
    if ((a->zbuffer < pbVar4) && ((uVar8 << 8 | uVar12) * -0x42108421 < 0x8421085)) {
      if ((uVar12 & 0x20) == 0) {
        if ((uVar8 & 0xf) == 8) goto LAB_0016405b;
        stbi__g_failure_reason = "bad compression";
      }
      else {
        stbi__g_failure_reason = "no preset dict";
      }
    }
    else {
      stbi__g_failure_reason = "bad zlib header";
    }
LAB_0016402e:
    iVar9 = 0;
  }
switchD_001640d9_caseD_3:
  return iVar9;
}

Assistant:

static int stbi__do_zlib(stbi__zbuf *a, char *obuf, int olen, int exp, int parse_header)
{
   a->zout_start = obuf;
   a->zout       = obuf;
   a->zout_end   = obuf + olen;
   a->z_expandable = exp;

   return stbi__parse_zlib(a, parse_header);
}